

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::MessageHints::RequestHintOnFieldNumbers
          (MessageHints *this,Message *reason,ErrorLocation reason_location,int range_start,
          int range_end)

{
  int iVar1;
  
  if (range_end < 1) {
    range_end = 0;
  }
  if (0x1ffffffe < range_end) {
    range_end = 0x1fffffff;
  }
  if (range_start < 1) {
    range_start = 0;
  }
  if (0x1ffffffe < range_start) {
    range_start = 0x1fffffff;
  }
  iVar1 = range_end - range_start;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  iVar1 = iVar1 + this->fields_to_suggest;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  if (0x1ffffffe < iVar1) {
    iVar1 = 0x1fffffff;
  }
  this->fields_to_suggest = iVar1;
  if (this->first_reason != (Message *)0x0) {
    return;
  }
  this->first_reason = reason;
  this->first_reason_location = reason_location;
  return;
}

Assistant:

void RequestHintOnFieldNumbers(
        const Message& reason,
        DescriptorPool::ErrorCollector::ErrorLocation reason_location,
        int range_start = 0, int range_end = 1) {
      auto fit = [](int value) {
        return std::min(std::max(value, 0), FieldDescriptor::kMaxNumber);
      };
      fields_to_suggest =
          fit(fields_to_suggest + fit(fit(range_end) - fit(range_start)));
      if (first_reason) return;
      first_reason = &reason;
      first_reason_location = reason_location;
    }